

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O0

void __thiscall LatencyItem::~LatencyItem(LatencyItem *this)

{
  Histogram *in_RDI;
  
  Histogram::~Histogram(in_RDI);
  std::__cxx11::string::~string((string *)in_RDI);
  return;
}

Assistant:

LatencyItem() {}